

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# impute.hpp
# Opt level: O0

void initialize_impute_calc<ImputedData<unsigned_long,double>,PredictionData<double,unsigned_long>>
               (ImputedData<unsigned_long,_double> *imp,
               PredictionData<double,_unsigned_long> *prediction_data,Imputer *imputer,size_t row)

{
  pointer pdVar1;
  uint uVar2;
  size_type sVar3;
  reference pvVar4;
  long in_RCX;
  ulong *in_RDX;
  long *in_RSI;
  vector<double,_std::allocator<double>_> *in_RDI;
  size_t col_5;
  size_t col_4;
  size_t col_3;
  size_t col_2;
  unsigned_long ix;
  size_t col_1;
  size_t col;
  vector<double,_std::allocator<double>_> *in_stack_fffffffffffffe78;
  int *in_stack_fffffffffffffe80;
  vector<double,_std::allocator<double>_> *this;
  __normal_iterator<double_*,_std::vector<double,_std::allocator<double>_>_>
  in_stack_fffffffffffffe88;
  __normal_iterator<double_*,_std::vector<double,_std::allocator<double>_>_> __last;
  __normal_iterator<double_*,_std::vector<double,_std::allocator<double>_>_>
  in_stack_fffffffffffffe90;
  ulong in_stack_fffffffffffffe98;
  vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
  *in_stack_fffffffffffffea0;
  value_type in_stack_fffffffffffffea8;
  vector<double,_std::allocator<double>_> *in_stack_fffffffffffffeb0;
  pointer local_128;
  ulong local_f8;
  ulong local_e8;
  vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
  *local_e0;
  ulong local_88;
  vector<double,_std::allocator<double>_> *local_30;
  ulong local_28;
  
  in_RDI[9].super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
  _M_start = (pointer)0x0;
  in_RDI[9].super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
  _M_finish = (pointer)0x0;
  in_RDI[9].super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)0x0;
  if (*in_RSI == 0) {
    if (in_RSI[9] != 0) {
      sVar3 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::size
                        ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)(in_RDI + 8));
      if (sVar3 == 0) {
        std::vector<unsigned_long,_std::allocator<unsigned_long>_>::resize
                  ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)
                   in_stack_fffffffffffffea0,in_stack_fffffffffffffe98);
      }
      for (local_88 = *(ulong *)(in_RSI[0xb] + in_RCX * 8);
          local_88 < *(ulong *)(in_RSI[0xb] + 8 + in_RCX * 8); local_88 = local_88 + 1) {
        uVar2 = std::isnan(*(double *)(in_RSI[9] + local_88 * 8));
        if (((uVar2 & 1) != 0) ||
           (uVar2 = std::isinf(*(double *)(in_RSI[9] + local_88 * 8)), (uVar2 & 1) != 0)) {
          in_stack_fffffffffffffea8 = *(value_type *)(in_RSI[10] + local_88 * 8);
          pdVar1 = in_RDI[9].super__Vector_base<double,_std::allocator<double>_>._M_impl.
                   super__Vector_impl_data._M_end_of_storage;
          in_RDI[9].super__Vector_base<double,_std::allocator<double>_>._M_impl.
          super__Vector_impl_data._M_end_of_storage = (pointer)((long)pdVar1 + 1);
          pvVar4 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::operator[]
                             ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)(in_RDI + 8),
                              (size_type)pdVar1);
          *pvVar4 = in_stack_fffffffffffffea8;
        }
      }
      sVar3 = std::vector<double,_std::allocator<double>_>::size(in_RDI + 4);
      if (sVar3 == 0) {
        std::vector<double,_std::allocator<double>_>::resize
                  (in_stack_fffffffffffffeb0,in_stack_fffffffffffffea8,
                   (value_type_conflict *)in_stack_fffffffffffffea0);
        std::vector<double,_std::allocator<double>_>::resize
                  (in_stack_fffffffffffffeb0,in_stack_fffffffffffffea8,
                   (value_type_conflict *)in_stack_fffffffffffffea0);
      }
      else {
        std::vector<double,_std::allocator<double>_>::begin(in_stack_fffffffffffffe78);
        std::vector<double,_std::allocator<double>_>::begin(in_stack_fffffffffffffe78);
        __gnu_cxx::__normal_iterator<double_*,_std::vector<double,_std::allocator<double>_>_>::
        operator+((__normal_iterator<double_*,_std::vector<double,_std::allocator<double>_>_> *)
                  in_stack_fffffffffffffe88._M_current,(difference_type)in_stack_fffffffffffffe80);
        std::
        fill<__gnu_cxx::__normal_iterator<double*,std::vector<double,std::allocator<double>>>,int>
                  (in_stack_fffffffffffffe90,in_stack_fffffffffffffe88,in_stack_fffffffffffffe80);
        std::vector<double,_std::allocator<double>_>::begin(in_stack_fffffffffffffe78);
        std::vector<double,_std::allocator<double>_>::begin(in_stack_fffffffffffffe78);
        __gnu_cxx::__normal_iterator<double_*,_std::vector<double,_std::allocator<double>_>_>::
        operator+((__normal_iterator<double_*,_std::vector<double,_std::allocator<double>_>_> *)
                  in_stack_fffffffffffffe88._M_current,(difference_type)in_stack_fffffffffffffe80);
        std::
        fill<__gnu_cxx::__normal_iterator<double*,std::vector<double,std::allocator<double>>>,int>
                  (in_stack_fffffffffffffe90,in_stack_fffffffffffffe88,in_stack_fffffffffffffe80);
      }
    }
  }
  else {
    sVar3 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::size
                      ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)(in_RDI + 6));
    if (sVar3 == 0) {
      std::vector<unsigned_long,_std::allocator<unsigned_long>_>::resize
                ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)in_stack_fffffffffffffea0,
                 in_stack_fffffffffffffe98);
    }
    if ((*(byte *)(in_RSI + 3) & 1) == 0) {
      for (local_30 = (vector<double,_std::allocator<double>_> *)0x0;
          local_30 < (vector<double,_std::allocator<double>_> *)*in_RDX;
          local_30 = (vector<double,_std::allocator<double>_> *)
                     ((long)&(local_30->super__Vector_base<double,_std::allocator<double>_>)._M_impl
                             .super__Vector_impl_data._M_start + 1)) {
        uVar2 = std::isnan(*(double *)
                            (*in_RSI +
                            (long)((long)&(local_30->
                                          super__Vector_base<double,_std::allocator<double>_>).
                                          _M_impl.super__Vector_impl_data._M_start +
                                  in_RCX * *in_RDX) * 8));
        if (((uVar2 & 1) != 0) ||
           (uVar2 = std::isinf(*(double *)
                                (*in_RSI +
                                (long)((long)&(local_30->
                                              super__Vector_base<double,_std::allocator<double>_>).
                                              _M_impl.super__Vector_impl_data._M_start +
                                      in_RCX * *in_RDX) * 8)), (uVar2 & 1) != 0)) {
          pdVar1 = in_RDI[9].super__Vector_base<double,_std::allocator<double>_>._M_impl.
                   super__Vector_impl_data._M_start;
          in_RDI[9].super__Vector_base<double,_std::allocator<double>_>._M_impl.
          super__Vector_impl_data._M_start = (pointer)((long)pdVar1 + 1);
          in_stack_fffffffffffffeb0 = local_30;
          pvVar4 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::operator[]
                             ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)(in_RDI + 6),
                              (size_type)pdVar1);
          *pvVar4 = (value_type)in_stack_fffffffffffffeb0;
        }
      }
    }
    else {
      for (local_28 = 0; local_28 < *in_RDX; local_28 = local_28 + 1) {
        uVar2 = std::isnan(*(double *)(*in_RSI + (in_RCX + local_28 * in_RSI[2]) * 8));
        if (((uVar2 & 1) != 0) ||
           (uVar2 = std::isinf(*(double *)(*in_RSI + (in_RCX + local_28 * in_RSI[2]) * 8)),
           (uVar2 & 1) != 0)) {
          pdVar1 = in_RDI[9].super__Vector_base<double,_std::allocator<double>_>._M_impl.
                   super__Vector_impl_data._M_start;
          in_RDI[9].super__Vector_base<double,_std::allocator<double>_>._M_impl.
          super__Vector_impl_data._M_start = (pointer)((long)pdVar1 + 1);
          pvVar4 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::operator[]
                             ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)(in_RDI + 6),
                              (size_type)pdVar1);
          *pvVar4 = local_28;
        }
      }
    }
    sVar3 = std::vector<double,_std::allocator<double>_>::size(in_RDI);
    if (sVar3 == 0) {
      std::vector<double,_std::allocator<double>_>::resize
                (in_stack_fffffffffffffeb0,in_stack_fffffffffffffea8,
                 (value_type_conflict *)in_stack_fffffffffffffea0);
      std::vector<double,_std::allocator<double>_>::resize
                (in_stack_fffffffffffffeb0,in_stack_fffffffffffffea8,
                 (value_type_conflict *)in_stack_fffffffffffffea0);
    }
    else {
      std::vector<double,_std::allocator<double>_>::begin(in_stack_fffffffffffffe78);
      std::vector<double,_std::allocator<double>_>::begin(in_stack_fffffffffffffe78);
      __gnu_cxx::__normal_iterator<double_*,_std::vector<double,_std::allocator<double>_>_>::
      operator+((__normal_iterator<double_*,_std::vector<double,_std::allocator<double>_>_> *)
                in_stack_fffffffffffffe88._M_current,(difference_type)in_stack_fffffffffffffe80);
      std::
      fill<__gnu_cxx::__normal_iterator<double*,std::vector<double,std::allocator<double>>>,int>
                (in_stack_fffffffffffffe90,in_stack_fffffffffffffe88,in_stack_fffffffffffffe80);
      std::vector<double,_std::allocator<double>_>::begin(in_stack_fffffffffffffe78);
      std::vector<double,_std::allocator<double>_>::begin(in_stack_fffffffffffffe78);
      __gnu_cxx::__normal_iterator<double_*,_std::vector<double,_std::allocator<double>_>_>::
      operator+((__normal_iterator<double_*,_std::vector<double,_std::allocator<double>_>_> *)
                in_stack_fffffffffffffe88._M_current,(difference_type)in_stack_fffffffffffffe80);
      std::
      fill<__gnu_cxx::__normal_iterator<double*,std::vector<double,std::allocator<double>>>,int>
                (in_stack_fffffffffffffe90,in_stack_fffffffffffffe88,in_stack_fffffffffffffe80);
    }
  }
  if (in_RSI[1] != 0) {
    sVar3 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::size
                      ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)(in_RDI + 7));
    if (sVar3 == 0) {
      std::vector<unsigned_long,_std::allocator<unsigned_long>_>::resize
                ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)in_stack_fffffffffffffea0,
                 in_stack_fffffffffffffe98);
    }
    if ((*(byte *)(in_RSI + 3) & 1) == 0) {
      for (local_e8 = 0; local_e8 < in_RDX[1]; local_e8 = local_e8 + 1) {
        if (*(int *)(in_RSI[1] + (local_e8 + in_RCX * in_RDX[1]) * 4) < 0) {
          pdVar1 = in_RDI[9].super__Vector_base<double,_std::allocator<double>_>._M_impl.
                   super__Vector_impl_data._M_finish;
          in_RDI[9].super__Vector_base<double,_std::allocator<double>_>._M_impl.
          super__Vector_impl_data._M_finish = (pointer)((long)pdVar1 + 1);
          in_stack_fffffffffffffe98 = local_e8;
          pvVar4 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::operator[]
                             ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)(in_RDI + 7),
                              (size_type)pdVar1);
          *pvVar4 = in_stack_fffffffffffffe98;
        }
      }
    }
    else {
      for (local_e0 = (vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
                       *)0x0;
          local_e0 <
          (vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
           *)in_RDX[1];
          local_e0 = (vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
                      *)((long)&(local_e0->
                                super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
                                )._M_impl.super__Vector_impl_data._M_start + 1)) {
        if (*(int *)(in_RSI[1] + (in_RCX + (long)local_e0 * in_RSI[2]) * 4) < 0) {
          pdVar1 = in_RDI[9].super__Vector_base<double,_std::allocator<double>_>._M_impl.
                   super__Vector_impl_data._M_finish;
          in_RDI[9].super__Vector_base<double,_std::allocator<double>_>._M_impl.
          super__Vector_impl_data._M_finish = (pointer)((long)pdVar1 + 1);
          in_stack_fffffffffffffea0 = local_e0;
          pvVar4 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::operator[]
                             ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)(in_RDI + 7),
                              (size_type)pdVar1);
          *pvVar4 = (value_type)in_stack_fffffffffffffea0;
        }
      }
    }
    sVar3 = std::vector<double,_std::allocator<double>_>::size(in_RDI + 3);
    if (sVar3 == 0) {
      std::vector<double,_std::allocator<double>_>::resize
                (in_stack_fffffffffffffeb0,in_stack_fffffffffffffea8,
                 (value_type_conflict *)in_stack_fffffffffffffea0);
      std::
      vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
      ::resize(in_stack_fffffffffffffea0,in_stack_fffffffffffffe98);
      for (local_f8 = 0; local_f8 < in_RDX[1]; local_f8 = local_f8 + 1) {
        std::
        vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
        ::operator[]((vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
                      *)(in_RDI + 2),local_f8);
        std::vector<int,_std::allocator<int>_>::operator[]
                  ((vector<int,_std::allocator<int>_> *)(in_RDX + 2),local_f8);
        std::vector<double,_std::allocator<double>_>::resize
                  (in_stack_fffffffffffffeb0,in_stack_fffffffffffffea8,
                   (value_type_conflict *)in_stack_fffffffffffffea0);
      }
    }
    else {
      std::vector<double,_std::allocator<double>_>::begin(in_stack_fffffffffffffe78);
      std::vector<double,_std::allocator<double>_>::begin(in_stack_fffffffffffffe78);
      __gnu_cxx::__normal_iterator<double_*,_std::vector<double,_std::allocator<double>_>_>::
      operator+((__normal_iterator<double_*,_std::vector<double,_std::allocator<double>_>_> *)
                in_stack_fffffffffffffe88._M_current,(difference_type)in_stack_fffffffffffffe80);
      std::
      fill<__gnu_cxx::__normal_iterator<double*,std::vector<double,std::allocator<double>>>,int>
                (in_stack_fffffffffffffe90,in_stack_fffffffffffffe88,in_stack_fffffffffffffe80);
      for (local_128 = (pointer)0x0;
          local_128 <
          in_RDI[9].super__Vector_base<double,_std::allocator<double>_>._M_impl.
          super__Vector_impl_data._M_finish; local_128 = (pointer)((long)local_128 + 1)) {
        this = in_RDI + 2;
        pvVar4 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::operator[]
                           ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)(in_RDI + 7),
                            (size_type)local_128);
        std::
        vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
        ::operator[]((vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
                      *)this,*pvVar4);
        std::vector<double,_std::allocator<double>_>::begin(in_stack_fffffffffffffe78);
        __last._M_current = (double *)(in_RDI + 2);
        pvVar4 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::operator[]
                           ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)(in_RDI + 7),
                            (size_type)local_128);
        std::
        vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
        ::operator[]((vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
                      *)__last._M_current,*pvVar4);
        std::vector<double,_std::allocator<double>_>::end(in_stack_fffffffffffffe78);
        std::
        fill<__gnu_cxx::__normal_iterator<double*,std::vector<double,std::allocator<double>>>,int>
                  (in_stack_fffffffffffffe90,__last,(int *)this);
      }
    }
  }
  return;
}

Assistant:

void initialize_impute_calc(ImputedData &imp, PredictionData &prediction_data, Imputer &imputer, size_t row)
{
    imp.n_missing_num = 0;
    imp.n_missing_cat = 0;
    imp.n_missing_sp  = 0;

    if (prediction_data.numeric_data != NULL)
    {
        if (!imp.missing_num.size())
            imp.missing_num.resize(imputer.ncols_numeric);

        if (prediction_data.is_col_major)
        {
            for (size_t col = 0; col < imputer.ncols_numeric; col++)
                if (is_na_or_inf(prediction_data.numeric_data[row + col * prediction_data.nrows]))
                    imp.missing_num[imp.n_missing_num++] = col;
        }

        else
        {
            for (size_t col = 0; col < imputer.ncols_numeric; col++)
                if (is_na_or_inf(prediction_data.numeric_data[col + row * imputer.ncols_numeric]))
                    imp.missing_num[imp.n_missing_num++] = col;
        }

        if (!imp.num_sum.size())
        {
            imp.num_sum.resize(imputer.ncols_numeric,    0);
            imp.num_weight.resize(imputer.ncols_numeric, 0);
        }

        else
        {
            std::fill(imp.num_sum.begin(),     imp.num_sum.begin()    + imp.n_missing_num,  0);
            std::fill(imp.num_weight.begin(),  imp.num_weight.begin() + imp.n_missing_num,  0);
        }
    }

    else if (prediction_data.Xr != NULL)
    {
        if (!imp.missing_sp.size())
            imp.missing_sp.resize(imputer.ncols_numeric);
        for (auto ix = prediction_data.Xr_indptr[row]; ix < prediction_data.Xr_indptr[row + 1]; ix++)
            if (is_na_or_inf(prediction_data.Xr[ix]))
                imp.missing_sp[imp.n_missing_sp++] = prediction_data.Xr_ind[ix];

        if (!imp.sp_num_sum.size())
        {
            imp.sp_num_sum.resize(imputer.ncols_numeric,    0);
            imp.sp_num_weight.resize(imputer.ncols_numeric, 0);
        }

        else
        {
            std::fill(imp.sp_num_sum.begin(),     imp.sp_num_sum.begin()    + imp.n_missing_sp,  0);
            std::fill(imp.sp_num_weight.begin(),  imp.sp_num_weight.begin() + imp.n_missing_sp,  0);
        }
    }
    
    if (prediction_data.categ_data != NULL)
    {
        if (!imp.missing_cat.size())
            imp.missing_cat.resize(imputer.ncols_categ);

        if (prediction_data.is_col_major)
        {
            for (size_t col = 0; col < imputer.ncols_categ; col++)
            {
                if (prediction_data.categ_data[row + col * prediction_data.nrows] < 0)
                    imp.missing_cat[imp.n_missing_cat++] = col;
            }
        }

        else
        {
            for (size_t col = 0; col < imputer.ncols_categ; col++)
            {
                if (prediction_data.categ_data[col + row * imputer.ncols_categ] < 0)
                    imp.missing_cat[imp.n_missing_cat++] = col;
            }
        }

        if (!imp.cat_weight.size())
        {
            imp.cat_weight.resize(imputer.ncols_categ, 0);
            imp.cat_sum.resize(imputer.ncols_categ);
            for (size_t col = 0; col < imputer.ncols_categ; col++)
                imp.cat_sum[col].resize(imputer.ncat[col], 0);
        }

        else
        {
            std::fill(imp.cat_weight.begin(), imp.cat_weight.begin() + imp.n_missing_cat, 0);
            for (size_t col = 0; col < imp.n_missing_cat; col++)
                std::fill(imp.cat_sum[imp.missing_cat[col]].begin(),
                          imp.cat_sum[imp.missing_cat[col]].end(),
                          0);
        }
    }
}